

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O3

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
::next_impl<0ul,1ul>(void *param_1,undefined8 *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 local_50;
  long local_48;
  
  lVar16 = this[0xb];
  lVar1 = this[0x17];
  lVar17 = this[9];
  lVar2 = this[0x15];
  lVar19 = this[3];
  lVar18 = this[5];
  lVar3 = this[0x11];
  lVar4 = this[0xf];
  bVar9 = lVar19 != lVar4;
  bVar10 = lVar18 != lVar3;
  bVar11 = lVar17 == lVar2;
  bVar12 = lVar16 == lVar1;
  lVar5 = this[10];
  lVar6 = this[0xd];
  if (bVar11 && bVar12) {
    if (bVar9 || bVar10) {
      local_50 = this[2];
      local_48 = this[4];
      uVar21 = *(undefined4 *)(this + 6);
      uVar22 = *(undefined4 *)((long)this + 0x34);
      uVar23 = *(undefined4 *)(this + 7);
      uVar24 = *(undefined4 *)((long)this + 0x3c);
      if ((lVar19 == 0) && (lVar18 != this[7])) {
        lVar18 = lVar18 + *(long *)(local_48 + 8) * 0x14;
        lVar19 = 0;
      }
      else {
        lVar19 = lVar19 + 1;
      }
      goto LAB_0010f3a4;
    }
  }
  else if (lVar16 == lVar6 || lVar17 != 0) {
    lVar17 = lVar17 + 1;
  }
  else {
    lVar16 = lVar16 + *(long *)(lVar5 + 8) * 0x14;
    lVar17 = 0;
  }
  local_50 = this[2];
  local_48 = this[4];
  uVar21 = *(undefined4 *)(this + 6);
  uVar22 = *(undefined4 *)((long)this + 0x34);
  uVar23 = *(undefined4 *)(this + 7);
  uVar24 = *(undefined4 *)((long)this + 0x3c);
LAB_0010f3a4:
  uVar7 = this[8];
  uVar8 = this[0xc];
  bVar13 = lVar2 != lVar17 || lVar1 != lVar16;
  if (bVar11 && bVar12) {
    bVar13 = (bVar9 || bVar10) != (lVar4 == lVar19 && lVar3 == lVar18) &&
             (lVar2 == lVar17 && lVar1 == lVar16);
  }
  if (bVar13) {
    uVar20 = 0;
  }
  else {
    uVar20 = *(undefined8 *)*this;
  }
  *(undefined8 **)param_1 = (undefined8 *)*this;
  *(undefined8 *)((long)param_1 + 8) = uVar20;
  *(undefined8 *)((long)param_1 + 0x10) = local_50;
  *(long *)((long)param_1 + 0x18) = lVar19;
  *(long *)((long)param_1 + 0x20) = local_48;
  *(long *)((long)param_1 + 0x28) = lVar18;
  *(undefined4 *)((long)param_1 + 0x30) = uVar21;
  *(undefined4 *)((long)param_1 + 0x34) = uVar22;
  *(undefined4 *)((long)param_1 + 0x38) = uVar23;
  *(undefined4 *)((long)param_1 + 0x3c) = uVar24;
  *(undefined8 *)((long)param_1 + 0x40) = uVar7;
  *(long *)((long)param_1 + 0x48) = lVar17;
  *(long *)((long)param_1 + 0x50) = lVar5;
  *(long *)((long)param_1 + 0x58) = lVar16;
  *(undefined8 *)((long)param_1 + 0x60) = uVar8;
  *(long *)((long)param_1 + 0x68) = lVar6;
  uVar7 = this[0xf];
  uVar8 = this[0x10];
  uVar20 = this[0x11];
  uVar14 = this[0x12];
  uVar15 = this[0x13];
  *(undefined8 *)((long)param_1 + 0x70) = this[0xe];
  *(undefined8 *)((long)param_1 + 0x78) = uVar7;
  *(undefined8 *)((long)param_1 + 0x80) = uVar8;
  *(undefined8 *)((long)param_1 + 0x88) = uVar20;
  *(undefined8 *)((long)param_1 + 0x90) = uVar14;
  *(undefined8 *)((long)param_1 + 0x98) = uVar15;
  uVar7 = this[0x15];
  uVar8 = this[0x16];
  uVar20 = this[0x17];
  uVar14 = this[0x18];
  uVar15 = this[0x19];
  *(undefined8 *)((long)param_1 + 0xa0) = this[0x14];
  *(undefined8 *)((long)param_1 + 0xa8) = uVar7;
  *(undefined8 *)((long)param_1 + 0xb0) = uVar8;
  *(undefined8 *)((long)param_1 + 0xb8) = uVar20;
  *(undefined8 *)((long)param_1 + 0xc0) = uVar14;
  *(undefined8 *)((long)param_1 + 200) = uVar15;
  return (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          *)param_1;
}

Assistant:

vbox_line next_impl(std::index_sequence<N...> indices) const {
            auto current = current_index(indices);
            block_iterators nxt(((N != current) ? std::get<N>(lines_) : std::next(std::get<N>(lines_)))...);
            return {
                vbox_,
                (find_true((std::get<N>(nxt) != std::get<N>(ends_))...) != current) ? vbox_->margin_ : 0,
                nxt,
                ends_
            };
        }